

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O0

long get_cost(obj *obj,monst *shkp)

{
  bool bVar1;
  schar sVar2;
  boolean bVar3;
  int local_24;
  boolean pseudorand;
  long lStack_20;
  int i;
  long tmp;
  monst *shkp_local;
  obj *obj_local;
  
  lStack_20 = getprice(obj,'\0');
  if (lStack_20 == 0) {
    lStack_20 = 5;
  }
  if (((*(uint *)&obj->field_0x4a >> 5 & 1) == 0) || ((objects[obj->otyp].field_0x10 & 1) == 0)) {
    if ((obj->oclass == '\r') && ((*(ushort *)&objects[obj->otyp].field_0x11 >> 4 & 0x1f) == 0x13))
    {
      bVar1 = (int)obj->otyp / 2 <= (int)u.ubirthday % (int)obj->otyp;
      switch(obj->otyp) {
      case 0x206:
        local_24 = 0x1fd;
        if (bVar1) {
          local_24 = 0x1f1;
        }
        break;
      case 0x207:
        local_24 = 0x1f9;
        if (bVar1) {
          local_24 = 500;
        }
        break;
      case 0x208:
        local_24 = 0x201;
        if (bVar1) {
          local_24 = 0x1f2;
        }
        break;
      case 0x209:
        local_24 = 0x1fb;
        if (bVar1) {
          local_24 = 0x1fa;
        }
        break;
      case 0x20a:
        local_24 = 0x204;
        if (bVar1) {
          local_24 = 499;
        }
        break;
      case 0x20b:
        local_24 = 0x1fe;
        if (bVar1) {
          local_24 = 0x1f8;
        }
        break;
      case 0x20c:
        local_24 = 0x1fc;
        if (bVar1) {
          local_24 = 0x1f5;
        }
        break;
      case 0x20d:
        local_24 = 0x205;
        if (bVar1) {
          local_24 = 0x1f6;
        }
        break;
      case 0x20e:
        local_24 = 0x202;
        if (bVar1) {
          local_24 = 0x200;
        }
        break;
      default:
        warning("bad glass gem %d?",(ulong)(uint)(int)obj->otyp);
        local_24 = 0;
      }
      lStack_20 = (long)objects[local_24].oc_cost;
    }
    else if ((obj->o_id & 3) == 0) {
      lStack_20 = lStack_20 / 3 + lStack_20;
    }
  }
  if (((urole.malenum == 0x166) && (u.ulevel < 0xf)) ||
     ((uarmu != (obj *)0x0 && ((uarm == (obj *)0x0 && (uarmc == (obj *)0x0)))))) {
    lStack_20 = lStack_20 / 3 + lStack_20;
  }
  else if ((uarmh != (obj *)0x0) && (uarmh->otyp == 0x4d)) {
    lStack_20 = lStack_20 / 3 + lStack_20;
  }
  sVar2 = acurr(5);
  if (sVar2 < '\x13') {
    sVar2 = acurr(5);
    if (sVar2 < '\x12') {
      sVar2 = acurr(5);
      if (sVar2 < '\x10') {
        sVar2 = acurr(5);
        if (sVar2 < '\x06') {
          lStack_20 = lStack_20 << 1;
        }
        else {
          sVar2 = acurr(5);
          if (sVar2 < '\b') {
            lStack_20 = lStack_20 / 2 + lStack_20;
          }
          else {
            sVar2 = acurr(5);
            if (sVar2 < '\v') {
              lStack_20 = lStack_20 / 3 + lStack_20;
            }
          }
        }
      }
      else {
        lStack_20 = lStack_20 - lStack_20 / 4;
      }
    }
    else {
      lStack_20 = lStack_20 - lStack_20 / 3;
    }
  }
  else {
    lStack_20 = lStack_20 / 2;
  }
  if (lStack_20 < 1) {
    lStack_20 = 1;
  }
  else if (obj->oartifact != '\0') {
    lStack_20 = lStack_20 << 2;
  }
  if ((shkp != (monst *)0x0) && (*(char *)((long)&shkp[0x1b].meating + 2) != '\0')) {
    lStack_20 = (lStack_20 + 2) / 3 + lStack_20;
  }
  bVar3 = on_level(&u.uz,&dungeon_topology.d_blackmarket_level);
  if (bVar3 != '\0') {
    if ((((((obj->oclass == '\x04') || (obj->oclass == '\x05')) || (obj->oclass == '\b')) ||
         ((obj->oclass == '\t' || (obj->oclass == '\n')))) ||
        ((obj->oclass == '\v' || ((obj->otyp == 0x20f || (obj->otyp == 0x210)))))) ||
       (((byte)objects[obj->otyp].field_0x10 >> 4 & 1) != 0)) {
      lStack_20 = lStack_20 * 0x32;
    }
    else {
      lStack_20 = lStack_20 * 0x19;
    }
  }
  return lStack_20;
}

Assistant:

static long get_cost(const struct obj *obj,
		     struct monst *shkp) /* if angry, impose a surcharge */
{
	long tmp = getprice(obj, FALSE);

	if (!tmp) tmp = 5L;
	/* shopkeeper may notice if the player isn't very knowledgeable -
	   especially when gem prices are concerned */
	if (!obj->dknown || !objects[obj->otyp].oc_name_known) {
		if (obj->oclass == GEM_CLASS &&
			objects[obj->otyp].oc_material == GLASS) {
		    int i;
		    /* get a value that's 'random' from game to game, but the
		       same within the same game */
		    boolean pseudorand =
			(((int)u.ubirthday % obj->otyp) >= obj->otyp/2);

		    /* all gems are priced high - real or not */
		    switch(obj->otyp - LAST_GEM) {
			case 1: /* white */
			    i = pseudorand ? DIAMOND : OPAL;
			    break;
			case 2: /* blue */
			    i = pseudorand ? SAPPHIRE : AQUAMARINE;
			    break;
			case 3: /* red */
			    i = pseudorand ? RUBY : JASPER;
			    break;
			case 4: /* yellowish brown */
			    i = pseudorand ? AMBER : TOPAZ;
			    break;
			case 5: /* orange */
			    i = pseudorand ? JACINTH : AGATE;
			    break;
			case 6: /* yellow */
			    i = pseudorand ? CITRINE : CHRYSOBERYL;
			    break;
			case 7: /* black */
			    i = pseudorand ? BLACK_OPAL : JET;
			    break;
			case 8: /* green */
			    i = pseudorand ? EMERALD : JADE;
			    break;
			case 9: /* violet */
			    i = pseudorand ? AMETHYST : FLUORITE;
			    break;
			default: warning("bad glass gem %d?", obj->otyp);
			    i = STRANGE_OBJECT;
			    break;
		    }
		    tmp = (long) objects[i].oc_cost;
		} else if (!(obj->o_id % 4)) /* arbitrarily impose surcharge */
		    tmp += tmp / 3L;
	}
	if ((Role_if (PM_TOURIST) && u.ulevel < (MAXULEV/2))
	    || (uarmu && !uarm && !uarmc))	/* touristy shirt visible */
		tmp += tmp / 3L;
	else if (uarmh && uarmh->otyp == DUNCE_CAP)
		tmp += tmp / 3L;

	if (ACURR(A_CHA) > 18)		tmp /= 2L;
	else if (ACURR(A_CHA) > 17)	tmp -= tmp / 3L;
	else if (ACURR(A_CHA) > 15)	tmp -= tmp / 4L;
	else if (ACURR(A_CHA) < 6)	tmp *= 2L;
	else if (ACURR(A_CHA) < 8)	tmp += tmp / 2L;
	else if (ACURR(A_CHA) < 11)	tmp += tmp / 3L;
	if (tmp <= 0L) tmp = 1L;
	else if (obj->oartifact) tmp *= 4L;
	/* anger surcharge should match rile_shk's */
	if (shkp && ESHK(shkp)->surcharge) tmp += (tmp + 2L) / 3L;

	/* Big mark-up for Black Market items. */
	if (Is_blackmarket(&u.uz)) {
	    if (obj->oclass==RING_CLASS    || obj->oclass==AMULET_CLASS   ||
		obj->oclass==POTION_CLASS  || obj->oclass==SCROLL_CLASS   ||
		obj->oclass==SPBOOK_CLASS  || obj->oclass==WAND_CLASS     ||
		obj->otyp==LUCKSTONE       || obj->otyp==LOADSTONE        ||
		objects[obj->otyp].oc_magic) {
		tmp *= 50;
	    } else {
		tmp *= 25;
	    }
	}

	return tmp;
}